

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int CVodeSetNonlinearSolver(void *cvode_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Type SVar1;
  int iVar2;
  SUNNonlinearSolver in_RSI;
  CVodeMem in_RDI;
  int retval;
  CVodeMem cv_mem;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetNonlinearSolver","cvode_mem = NULL illegal."
                  );
    local_4 = -0x15;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    cvProcessError((CVodeMem)0x0,-0x16,"CVODE","CVodeSetNonlinearSolver","NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_realtype_int_void_ptr *)0x0))
          || (in_RSI->ops->setsysfn == (_func_int_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                   "NLS does not support required operations");
    local_4 = -0x16;
  }
  else {
    if ((in_RDI->NLS != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLS != 0)) {
      in_stack_ffffffffffffffdc =
           SUNNonlinSolFree((SUNNonlinearSolver)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    in_RDI->NLS = in_RSI;
    in_RDI->ownNLS = 0;
    SVar1 = SUNNonlinSolGetType((SUNNonlinearSolver)0xefe68a);
    if (SVar1 == SUNNONLINEARSOLVER_ROOTFIND) {
      iVar2 = SUNNonlinSolSetSysFn
                        ((SUNNonlinearSolver)in_RDI,
                         (SUNNonlinSolSysFn)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    else {
      SVar1 = SUNNonlinSolGetType((SUNNonlinearSolver)0xefe6b7);
      if (SVar1 != SUNNONLINEARSOLVER_FIXEDPOINT) {
        cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                       "Invalid nonlinear solver type");
        return -0x16;
      }
      iVar2 = SUNNonlinSolSetSysFn
                        ((SUNNonlinearSolver)in_RDI,
                         (SUNNonlinSolSysFn)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    if (iVar2 == 0) {
      iVar2 = SUNNonlinSolSetConvTestFn
                        (in_RSI,(SUNNonlinSolConvTestFn)in_RDI,
                         (void *)(ulong)in_stack_ffffffffffffffd8);
      if (iVar2 == 0) {
        iVar2 = SUNNonlinSolSetMaxIters((SUNNonlinearSolver)(ulong)in_stack_ffffffffffffffd8,0);
        if (iVar2 == 0) {
          in_RDI->cv_acnrmcur = 0;
          if (in_RDI->cv_f == (CVRhsFn)0x0) {
            cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                           "The ODE RHS function is NULL");
            local_4 = -0x16;
          }
          else {
            in_RDI->nls_f = in_RDI->cv_f;
            local_4 = 0;
          }
        }
        else {
          cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                         "Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                       "Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetNonlinearSolver",
                     "Setting nonlinear system function failed");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetNonlinearSolver(void *cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetNonlinearSolver", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL) {
    cvProcessError(NULL, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ( NLS->ops->gettype    == NULL ||
       NLS->ops->solve      == NULL ||
       NLS->ops->setsysfn   == NULL ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "NLS does not support required operations");
    return(CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLS != NULL) && (cv_mem->ownNLS))
    retval = SUNNonlinSolFree(cv_mem->NLS);

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLS = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLS = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND) {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsResidual);
  } else if (SUNNonlinSolGetType(NLS) ==  SUNNONLINEARSOLVER_FIXEDPOINT) {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsFPFunction);
  } else {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Invalid nonlinear solver type");
    return(CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting nonlinear system function failed");
    return(CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLS, cvNlsConvTest, cvode_mem);
  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting convergence test function failed");
    return(CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLS, NLS_MAXCOR);
  if (retval != CV_SUCCESS) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "Setting maximum number of nonlinear iterations failed");
    return(CV_ILL_INPUT);
  }

  /* Reset the acnrmcur flag to SUNFALSE */
  cv_mem->cv_acnrmcur = SUNFALSE;

  /* Set the nonlinear system RHS function */
  if (!(cv_mem->cv_f)) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetNonlinearSolver",
                   "The ODE RHS function is NULL");
    return(CV_ILL_INPUT);
  }
  cv_mem->nls_f = cv_mem->cv_f;

  return(CV_SUCCESS);
}